

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ManAppendAnd2(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int local_28;
  int local_24;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  if (p->fGiaSimple == 0) {
    if (iLit0 < 2) {
      local_24 = iLit1;
      if (iLit0 == 0) {
        local_24 = 0;
      }
      return local_24;
    }
    if (iLit1 < 2) {
      local_28 = iLit0;
      if (iLit1 == 0) {
        local_28 = 0;
      }
      return local_28;
    }
    if (iLit0 == iLit1) {
      return iLit1;
    }
    iVar1 = Abc_LitNot(iLit1);
    if (iLit0 == iVar1) {
      return 0;
    }
  }
  iVar1 = Gia_ManAppendAnd(p,iLit0,iLit1);
  return iVar1;
}

Assistant:

static inline int Gia_ManAppendAnd2( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    if ( !p->fGiaSimple )
    {
        if ( iLit0 < 2 )
            return iLit0 ? iLit1 : 0;
        if ( iLit1 < 2 )
            return iLit1 ? iLit0 : 0;
        if ( iLit0 == iLit1 )
            return iLit1;
        if ( iLit0 == Abc_LitNot(iLit1) )
            return 0;
    }
    return Gia_ManAppendAnd( p, iLit0, iLit1 );
}